

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-wast-parser.cc
# Opt level: O2

Errors * anon_unknown.dwarf_cf828::ParseInvalidModule(Errors *__return_storage_ptr__,string *text)

{
  string_view filename;
  char *message;
  Enum in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  undefined4 uStack_48;
  Result result;
  AssertionResult gtest_ar;
  AssertHelper local_30;
  WastParseOptions local_25;
  
  filename.size_._0_4_ = uStack_48;
  filename.data_ =
       (char *)lexer._M_t.
               super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
               super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
               super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl;
  filename.size_._4_4_ = result.enum_;
  wabt::WastLexer::CreateBufferLexer
            (filename,(void *)module._M_t.
                              super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>
                              .super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  module._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true>)
       (__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>)0x0;
  local_25.features.exceptions_enabled_ = false;
  local_25.features.mutable_globals_enabled_ = true;
  local_25.features.sat_float_to_int_enabled_ = false;
  local_25.features.sign_extension_enabled_ = false;
  local_25.features.simd_enabled_ = false;
  local_25.features.threads_enabled_ = false;
  local_25.features.multi_value_enabled_ = false;
  local_25.features.tail_call_enabled_ = false;
  local_25.features.bulk_memory_enabled_ = false;
  local_25.features.reference_types_enabled_ = false;
  local_25.features.annotations_enabled_ = false;
  local_25.features.gc_enabled_ = false;
  local_25.debug_parsing = false;
  result = wabt::ParseWatModule
                     ((WastLexer *)
                      lexer._M_t.
                      super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                      .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,&module,
                      __return_storage_ptr__,&local_25);
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)&gtest_ar,"Result::Error","result",(Enum *)&stack0xffffffffffffffa0,&result
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffa0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-wast-parser.cc"
               ,0x2b,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&stack0xffffffffffffffa0);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffa0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr(&module);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&lexer);
  return __return_storage_ptr__;
}

Assistant:

Errors ParseInvalidModule(std::string text) {
  auto lexer = WastLexer::CreateBufferLexer("test", text.c_str(), text.size());
  Errors errors;
  std::unique_ptr<Module> module;
  Features features;
  WastParseOptions options(features);
  Result result = ParseWatModule(lexer.get(), &module, &errors, &options);
  EXPECT_EQ(Result::Error, result);

  return errors;
}